

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status
ghc::filesystem::detail::symlink_status_ex
          (path *p,error_code *ec,uintmax_t *sz,uintmax_t *nhl,time_t *lwt)

{
  bool bVar1;
  int iVar2;
  value_type_conflict *__file;
  undefined8 *in_RDX;
  file_status in_RDI;
  error_code eVar3;
  int result;
  stat fs;
  file_status *f_s;
  file_status ec_00;
  uint in_stack_ffffffffffffff2c;
  stat local_c0;
  undefined8 *local_18;
  
  ec_00 = in_RDI;
  local_18 = in_RDX;
  __file = path::c_str((path *)0x134f00);
  iVar2 = lstat(__file,&local_c0);
  if (iVar2 == 0) {
    std::error_code::clear((error_code *)ec_00);
    file_status_from_st_mode<unsigned_int>(in_stack_ffffffffffffff2c);
  }
  else {
    eVar3 = make_system_error(ec_00._4_4_);
    *local_18 = CONCAT44(in_stack_ffffffffffffff2c,eVar3._M_value);
    local_18[1] = eVar3._M_cat;
    bVar1 = is_not_found_error((error_code *)ec_00);
    if (bVar1) {
      file_status::file_status((file_status *)in_RDI,not_found,unknown);
    }
    else {
      file_status::file_status((file_status *)in_RDI,none,unknown);
    }
  }
  return ec_00;
}

Assistant:

GHC_INLINE file_status symlink_status_ex(const path& p, std::error_code& ec, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr) noexcept
{
#ifdef GHC_OS_WINDOWS
    file_status fs;
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else {
        ec.clear();
        fs = detail::status_from_INFO(p, &attr, ec, sz, lwt);
        if (nhl) {
            *nhl = 0;
        }
        if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
            fs.type(file_type::symlink);
        }
    }
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found);
    }
    return ec ? file_status(file_type::none) : fs;
#else
    (void)sz;
    (void)nhl;
    (void)lwt;
    struct ::stat fs;
    auto result = ::lstat(p.c_str(), &fs);
    if (result == 0) {
        ec.clear();
        file_status f_s = detail::file_status_from_st_mode(fs.st_mode);
        return f_s;
    }
    ec = detail::make_system_error();
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found, perms::unknown);
    }
    return file_status(file_type::none);
#endif
}